

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall
discordpp::TeamMember::TeamMember
          (TeamMember *this,field<int> *membership_state,
          field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *permissions,field<discordpp::Snowflake> *team_id,field<discordpp::User> *user)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (membership_state->t_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl == (int *)0x0) {
    _Var3._M_head_impl = (int *)0x0;
  }
  else {
    _Var3._M_head_impl = (int *)operator_new(4);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->membership_state).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false> =
       (_Head_base<0UL,_int_*,_false>)_Var3._M_head_impl;
  (this->membership_state).s_ = membership_state->s_;
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::field(&this->permissions,permissions);
  _Var2._M_head_impl =
       (team_id->t_)._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (Snowflake *)0x0) {
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var2._M_head_impl)->_value;
  }
  (this->team_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->team_id).s_ = team_id->s_;
  field<discordpp::User>::field(&this->user,user);
  return;
}

Assistant:

TeamMember(
        field<int> membership_state = uninitialized,
        field<std::vector<std::string> > permissions = uninitialized,
        field<Snowflake> team_id = uninitialized,
        field<User> user = uninitialized
    ):
        membership_state(membership_state),
        permissions(permissions),
        team_id(team_id),
        user(user)
    {}